

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracking_ptr.hpp
# Opt level: O2

void __thiscall
boost::xpressive::detail::
enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::purge_stale_deps_(enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *this)

{
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  cur;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::weak_iterator(&local_50,(this->deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                  &this->deps_);
  weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::weak_iterator(&local_30,(base_iterator)&(this->deps_)._M_t._M_impl.super__Rb_tree_header,
                  &this->deps_);
  while (local_50.iter_._M_node != local_30.iter_._M_node) {
    weak_iterator<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::increment(&local_50);
  }
  boost::detail::shared_count::~shared_count(&local_30.cur_.pn);
  boost::detail::shared_count::~shared_count(&local_50.cur_.pn);
  return;
}

Assistant:

void purge_stale_deps_()
    {
        weak_iterator<Derived> cur(this->deps_.begin(), &this->deps_);
        weak_iterator<Derived> end(this->deps_.end(), &this->deps_);

        for(; cur != end; ++cur)
            ;
    }